

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMarkowitz(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *m)

{
  type_conflict5 tVar1;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  long in_RDI;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined8 local_80;
  undefined8 local_78;
  cpp_dec_float<50U,_int,_void> local_70;
  long local_38;
  undefined8 *local_30;
  undefined8 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffff0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffff8;
  
  local_70.data._M_elems[2] = 0xeb1c432d;
  local_70.data._M_elems[3] = 0x3f1a36e2;
  this_00 = in_RSI;
  tVar1 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_RSI,(double *)0x46e433);
  if (tVar1) {
    local_70.data._M_elems[0] = 0xeb1c432d;
    local_70.data._M_elems[1] = 0x3f1a36e2;
    local_18 = &local_70;
    in_stack_fffffffffffffff0 = this_00;
    in_stack_fffffffffffffff8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (local_18,(double)this_00);
  }
  local_78 = 0x3fefff2e48e8a71e;
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_RSI,(double *)0x46e4a7);
  if (tVar1) {
    local_80 = 0x3fefff2e48e8a71e;
    local_30 = &local_80;
    local_20 = local_30;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffffff8,(double)in_stack_fffffffffffffff0);
  }
  local_38 = in_RDI + 0x498;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,in_RSI);
  local_70._40_8_ = in_RDI + 0x460;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,in_RSI);
  return;
}

Assistant:

void setMarkowitz(R m)
   {
      if(m < 0.0001)
         m = 0.0001;

      if(m > 0.9999)
         m = 0.9999;

      minThreshold = m;
      lastThreshold = m;
   }